

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_handler.hpp
# Opt level: O0

void __thiscall
asio::detail::
binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
::operator()(binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
             *this)

{
  error_code *in_stack_00000008;
  function<void_(const_std::error_code_&,_unsigned_long)> *in_stack_00000010;
  
  std::function<void_(const_std::error_code_&,_unsigned_long)>::operator()
            (in_stack_00000010,in_stack_00000008,(unsigned_long)this);
  return;
}

Assistant:

void operator()()
  {
    static_cast<Handler&&>(handler_)(
        static_cast<const Arg1&>(arg1_),
        static_cast<const Arg2&>(arg2_));
  }